

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translator.cpp
# Opt level: O1

StmNode * __thiscall Translator::visit(Translator *this,ReturnNode *returnNode)

{
  int iVar1;
  SEQ *this_00;
  MOVE *this_01;
  TEMP *this_02;
  undefined4 extraout_var;
  JUMP *this_03;
  NAME *this_04;
  Label *unaff_R15;
  char endFuncLabel [50];
  char acStack_68 [56];
  
  if (this->activeFunction != (FunctionSymbol *)0x0) {
    sprintf(acStack_68,"%s_end",(this->activeFunction->super_Symbol).lexeme);
    unaff_R15 = (Label *)operator_new(0x10);
    Label::Label(unaff_R15,acStack_68);
  }
  this_00 = (SEQ *)operator_new(0x20);
  this_01 = (MOVE *)operator_new(0x20);
  this_02 = (TEMP *)operator_new(0x18);
  TEMP::TEMP(this_02,this->currentFrame->returnValue);
  iVar1 = (*(returnNode->exp->super_StmtNode).super_ASTNode._vptr_ASTNode[4])(returnNode->exp,this);
  MOVE::MOVE(this_01,(ExprNode *)this_02,(ExprNode *)CONCAT44(extraout_var,iVar1));
  this_03 = (JUMP *)operator_new(0x20);
  this_04 = (NAME *)operator_new(0x18);
  NAME::NAME(this_04,unaff_R15);
  JUMP::JUMP(this_03,(ExprNode *)this_04);
  SEQ::SEQ(this_00,(StmNode *)this_01,(StmNode *)this_03);
  return &this_00->super_StmNode;
}

Assistant:

StmNode *Translator::visit(ReturnNode *returnNode) {
    Label *funcLabel;
    if (activeFunction) {
        char endFuncLabel[50];
        sprintf(endFuncLabel, "%s_end", activeFunction->getLexeme());
        funcLabel = new Label(endFuncLabel);
    }
    return new SEQ(new MOVE(new TEMP(this->currentFrame->getReturnValue()), returnNode->getExp()->accept(this)),
                   new JUMP(new NAME(funcLabel)));
}